

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void kratos::fix_assignment_type(Generator *top)

{
  undefined1 local_a8 [8];
  AssignmentTypeVisitor final_visitor;
  AssignmentTypeBlockVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  final_visitor._72_8_ = &PTR_visit_root_00581cd8;
  IRVisitor::visit_root_tp((IRVisitor *)&final_visitor.type_,&top->super_IRNode);
  final_visitor.super_IRVisitor._8_8_ =
       &final_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  final_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  final_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  final_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  final_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  final_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  final_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  final_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  final_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8 = (undefined1  [8])&PTR_visit_root_00581e38;
  final_visitor.super_IRVisitor.visited_._M_h._M_single_bucket._0_4_ = 0;
  final_visitor.super_IRVisitor.visited_._M_h._M_single_bucket._4_1_ = 0;
  IRVisitor::visit_root_s((IRVisitor *)local_a8,&top->super_IRNode);
  IRVisitor::~IRVisitor((IRVisitor *)local_a8);
  IRVisitor::~IRVisitor((IRVisitor *)&final_visitor.type_);
  return;
}

Assistant:

void fix_assignment_type(Generator* top) {
    // first we fix all the block assignment
    AssignmentTypeBlockVisitor visitor;
    visitor.visit_root_tp(top);

    // then we assign any existing assignment as blocking assignment
    AssignmentTypeVisitor final_visitor(AssignmentType::Blocking, false);
    final_visitor.visit_root_s(top->ast_node());
}